

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
cpptrace::detail::optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
::swap(optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *this,
      optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *other)

{
  bool bVar1;
  anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>_2
  aVar2;
  
  if (this->holds_value == true) {
    if (other->holds_value == false) {
      aVar2 = this->field_0;
    }
    else {
      aVar2 = this->field_0;
      this->field_0 = other->field_0;
    }
    other->field_0 = aVar2;
  }
  else if (other->holds_value != false) {
    this->field_0 = other->field_0;
  }
  bVar1 = this->holds_value;
  this->holds_value = other->holds_value;
  other->holds_value = bVar1;
  return;
}

Assistant:

void swap(optional& other) noexcept {
            if(holds_value && other.holds_value) {
                std::swap(uvalue, other.uvalue);
            } else if(holds_value && !other.holds_value) {
                new (&other.uvalue) T(std::move(uvalue));
                uvalue.~T();
            } else if(!holds_value && other.holds_value) {
                new (static_cast<void*>(std::addressof(uvalue))) T(std::move(other.uvalue));
                other.uvalue.~T();
            }
            std::swap(holds_value, other.holds_value);
        }